

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.h
# Opt level: O0

clock_t __thiscall WaveformGenerator::clock(WaveformGenerator *this)

{
  uint uVar1;
  uint uVar2;
  WaveformGenerator *pWVar3;
  bool local_19;
  reg24 bit0;
  reg24 accumulator_prev;
  WaveformGenerator *this_local;
  
  pWVar3 = this;
  if (this->test == 0) {
    uVar2 = this->accumulator;
    this->accumulator = this->freq + this->accumulator;
    this->accumulator = this->accumulator & 0xffffff;
    local_19 = false;
    if ((uVar2 & 0x800000) == 0) {
      local_19 = (this->accumulator & 0x800000) != 0;
    }
    this->msb_rising = local_19;
    uVar2 = uVar2 & 0x80000;
    pWVar3 = (WaveformGenerator *)(ulong)uVar2;
    if ((uVar2 == 0) &&
       (uVar2 = this->accumulator & 0x80000, pWVar3 = (WaveformGenerator *)(ulong)uVar2, uVar2 != 0)
       ) {
      uVar2 = this->shift_register;
      uVar1 = this->shift_register;
      this->shift_register = this->shift_register << 1;
      this->shift_register = this->shift_register & 0x7fffff;
      this->shift_register = (uVar2 >> 0x16 ^ uVar1 >> 0x11) & 1 | this->shift_register;
      pWVar3 = this;
    }
  }
  return (clock_t)pWVar3;
}

Assistant:

RESID_INLINE
void WaveformGenerator::clock()
{
  // No operation if test bit is set.
  if (test) {
    return;
  }

  reg24 accumulator_prev = accumulator;

  // Calculate new accumulator value;
  accumulator += freq;
  accumulator &= 0xffffff;

  // Check whether the MSB is set high. This is used for synchronization.
  msb_rising = !(accumulator_prev & 0x800000) && (accumulator & 0x800000);

  // Shift noise register once for each time accumulator bit 19 is set high.
  if (!(accumulator_prev & 0x080000) && (accumulator & 0x080000)) {
    reg24 bit0 = ((shift_register >> 22) ^ (shift_register >> 17)) & 0x1;
    shift_register <<= 1;
    shift_register &= 0x7fffff;
    shift_register |= bit0;
  }
}